

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::ConfigureString
          (cmMakefile *this,string *input,string *output,bool atOnly,bool escapeQuotes)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  cmListFileContext *pcVar4;
  cmListFileContext *currentTrace;
  long lineNumber;
  char *filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  cmValue local_1b0;
  cmValue def_1;
  string indentation_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string indentation;
  string local_c0;
  cmValue local_a0;
  cmValue def;
  bool haveNewline;
  allocator<char> local_79;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined1 local_68 [8];
  string line;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  const_iterator lineEnd;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  const_iterator lineStart;
  bool escapeQuotes_local;
  bool atOnly_local;
  string *output_local;
  string *input_local;
  cmMakefile *this_local;
  
  lineStart._M_current._6_1_ = escapeQuotes;
  lineStart._M_current._7_1_ = atOnly;
  local_30._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    lineEnd._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_30,&lineEnd);
    if (!bVar1) break;
    local_40._M_current = local_30._M_current;
    while( true ) {
      line.field_2._8_8_ = std::__cxx11::string::end();
      bVar2 = __gnu_cxx::operator!=
                        (&local_40,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&line.field_2 + 8));
      bVar1 = false;
      if (bVar2) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_40);
        bVar1 = *pcVar3 != '\n';
      }
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_40);
    }
    local_70._M_current = local_30._M_current;
    local_78._M_current = local_40._M_current;
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)local_68,local_70,local_78,&local_79);
    std::allocator<char>::~allocator(&local_79);
    def.Value = (string *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&def);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_40);
    }
    bVar2 = cmsys::RegularExpression::find(&this->cmDefineRegex,(string *)local_68);
    if (bVar2) {
      cmsys::RegularExpression::match_abi_cxx11_(&local_c0,&this->cmDefineRegex,2);
      local_a0 = GetDefinition(this,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      indentation.field_2._8_8_ = local_a0.Value;
      bVar2 = cmIsOff(local_a0);
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)output,"/* #undef ");
        cmsys::RegularExpression::match_abi_cxx11_
                  ((string *)((long)&indentation_1.field_2 + 8),&this->cmDefineRegex,2);
        std::__cxx11::string::operator+=
                  ((string *)output,(string *)(indentation_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(indentation_1.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)output," */");
      }
      else {
        cmsys::RegularExpression::match_abi_cxx11_((string *)local_e8,&this->cmDefineRegex,1);
        std::operator+(&local_128,"#",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                      );
        std::operator+(&local_108,&local_128,"cmakedefine");
        std::operator+(&local_168,"#",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                      );
        std::operator+(&local_148,&local_168,"define");
        cmsys::SystemTools::ReplaceString((string *)local_68,&local_108,&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::operator+=((string *)output,(string *)local_68);
        std::__cxx11::string::~string((string *)local_e8);
      }
    }
    else {
      bVar2 = cmsys::RegularExpression::find(&this->cmDefine01Regex,(string *)local_68);
      if (bVar2) {
        cmsys::RegularExpression::match_abi_cxx11_((string *)&def_1,&this->cmDefine01Regex,1);
        cmsys::RegularExpression::match_abi_cxx11_(&local_1d0,&this->cmDefine01Regex,2);
        local_1b0 = GetDefinition(this,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::operator+(&local_210,"#",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&def_1);
        std::operator+(&local_1f0,&local_210,"cmakedefine01");
        std::operator+(&local_250,"#",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&def_1);
        std::operator+(&local_230,&local_250,"define");
        cmsys::SystemTools::ReplaceString((string *)local_68,&local_1f0,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::operator+=((string *)output,(string *)local_68);
        bVar2 = cmIsOff(local_1b0);
        if (bVar2) {
          std::__cxx11::string::operator+=((string *)output," 0");
        }
        else {
          std::__cxx11::string::operator+=((string *)output," 1");
        }
        std::__cxx11::string::~string((string *)&def_1);
      }
      else {
        std::__cxx11::string::operator+=((string *)output,(string *)local_68);
      }
    }
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)output,"\n");
    }
    local_30._M_current = local_40._M_current;
    std::__cxx11::string::~string((string *)local_68);
  }
  lineNumber = 0;
  currentTrace = (cmListFileContext *)0xffffffffffffffff;
  bVar1 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    (&(this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  if (!bVar1) {
    pcVar4 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       (&(this->Backtrace).
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
    lineNumber = std::__cxx11::string::c_str();
    currentTrace = (cmListFileContext *)pcVar4->Line;
  }
  ExpandVariablesInString
            (this,output,(bool)(lineStart._M_current._6_1_ & 1),true,
             (bool)(lineStart._M_current._7_1_ & 1),(char *)lineNumber,(long)currentTrace,true,true)
  ;
  return;
}

Assistant:

void cmMakefile::ConfigureString(const std::string& input, std::string& output,
                                 bool atOnly, bool escapeQuotes) const
{
  // Split input to handle one line at a time.
  std::string::const_iterator lineStart = input.begin();
  while (lineStart != input.end()) {
    // Find the end of this line.
    std::string::const_iterator lineEnd = lineStart;
    while (lineEnd != input.end() && *lineEnd != '\n') {
      ++lineEnd;
    }

    // Copy the line.
    std::string line(lineStart, lineEnd);

    // Skip the newline character.
    bool haveNewline = (lineEnd != input.end());
    if (haveNewline) {
      ++lineEnd;
    }

    // Replace #cmakedefine instances.
    if (this->cmDefineRegex.find(line)) {
      cmValue def = this->GetDefinition(this->cmDefineRegex.match(2));
      if (!cmIsOff(def)) {
        const std::string indentation = this->cmDefineRegex.match(1);
        cmSystemTools::ReplaceString(line, "#" + indentation + "cmakedefine",
                                     "#" + indentation + "define");
        output += line;
      } else {
        output += "/* #undef ";
        output += this->cmDefineRegex.match(2);
        output += " */";
      }
    } else if (this->cmDefine01Regex.find(line)) {
      const std::string indentation = this->cmDefine01Regex.match(1);
      cmValue def = this->GetDefinition(this->cmDefine01Regex.match(2));
      cmSystemTools::ReplaceString(line, "#" + indentation + "cmakedefine01",
                                   "#" + indentation + "define");
      output += line;
      if (!cmIsOff(def)) {
        output += " 1";
      } else {
        output += " 0";
      }
    } else {
      output += line;
    }

    if (haveNewline) {
      output += "\n";
    }

    // Move to the next line.
    lineStart = lineEnd;
  }

  // Perform variable replacements.
  const char* filename = nullptr;
  long lineNumber = -1;
  if (!this->Backtrace.Empty()) {
    const auto& currentTrace = this->Backtrace.Top();
    filename = currentTrace.FilePath.c_str();
    lineNumber = currentTrace.Line;
  }
  this->ExpandVariablesInString(output, escapeQuotes, true, atOnly, filename,
                                lineNumber, true, true);
}